

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O2

void G_BuildTiccmd(ticcmd_t *cmd)

{
  byte *pbVar1;
  short *psVar2;
  int iVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  undefined2 uVar7;
  BYTE BVar8;
  BYTE BVar9;
  BYTE BVar10;
  int iVar11;
  float fVar12;
  ticcmd_t *ptVar13;
  int iVar14;
  int iVar15;
  byte bVar16;
  short sVar17;
  short sVar18;
  uint uVar19;
  int iVar20;
  short sVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  float joyaxes [5];
  
  ptVar13 = I_BaseTiccmd();
  sVar21 = (ptVar13->ucmd).pitch;
  sVar18 = (ptVar13->ucmd).yaw;
  sVar17 = (ptVar13->ucmd).roll;
  sVar4 = (ptVar13->ucmd).forwardmove;
  sVar5 = (ptVar13->ucmd).sidemove;
  sVar6 = (ptVar13->ucmd).upmove;
  (cmd->ucmd).buttons = (ptVar13->ucmd).buttons;
  (cmd->ucmd).pitch = sVar21;
  (cmd->ucmd).yaw = sVar18;
  (cmd->ucmd).roll = sVar17;
  (cmd->ucmd).forwardmove = sVar4;
  (cmd->ucmd).sidemove = sVar5;
  (cmd->ucmd).upmove = sVar6;
  uVar7 = *(undefined2 *)&ptVar13->field_0x12;
  cmd->consistancy = ptVar13->consistancy;
  iVar20 = ticdup;
  *(undefined2 *)&cmd->field_0x12 = uVar7;
  cmd->consistancy =
       consistancy[consoleplayer]
       [(int)((long)((ulong)(uint)((int)((long)maketic / (long)ticdup) >> 0x1f) << 0x20 |
                    (long)maketic / (long)ticdup & 0xffffffffU) % 0x24)];
  BVar10 = Button_Strafe.bDown;
  bVar16 = cl_run.Value ^ Button_Speed.bDown;
  iVar15 = 0;
  turnheld = iVar20 + turnheld;
  if (Button_Left.bDown == '\0' && Button_Right.bDown == '\0') {
    turnheld = 0;
  }
  if (Button_Strafe.bDown == '\0') {
    uVar19 = bVar16 + 2;
    if (5 < turnheld) {
      uVar19 = (uint)bVar16;
    }
    if (Button_Right.bDown != '\0') {
      G_AddViewAngle(angleturn[uVar19]);
      LocalKeyboardTurner = true;
    }
    if (Button_Left.bDown == '\0') {
      iVar15 = 0;
    }
    else {
      iVar15 = 0;
      G_AddViewAngle(-angleturn[uVar19]);
      LocalKeyboardTurner = true;
    }
  }
  else {
    if (Button_Right.bDown != '\0') {
      iVar15 = sidemove[bVar16];
    }
    if (Button_Left.bDown != '\0') {
      iVar15 = iVar15 - sidemove[bVar16];
    }
  }
  if (Button_LookUp.bDown != '\0') {
    G_AddViewPitch(lookspeed[bVar16]);
    LocalKeyboardTurner = true;
  }
  if (Button_LookDown.bDown != '\0') {
    G_AddViewPitch(-lookspeed[bVar16]);
    LocalKeyboardTurner = true;
  }
  if (Button_MoveUp.bDown == '\0') {
    sVar21 = 0;
  }
  else {
    sVar21 = (short)flyspeed[bVar16];
  }
  if (Button_MoveDown.bDown != '\0') {
    sVar21 = sVar21 - (short)flyspeed[bVar16];
  }
  if (Button_Klook.bDown == '\0') {
    if (Button_Forward.bDown == '\0') {
      iVar20 = 0;
    }
    else {
      iVar20 = forwardmove[bVar16];
    }
    if (Button_Back.bDown != '\0') {
      iVar20 = iVar20 - forwardmove[bVar16];
    }
  }
  else {
    if (Button_Forward.bDown != '\0') {
      G_AddViewPitch(lookspeed[bVar16]);
    }
    if (Button_Back.bDown == '\0') {
      iVar20 = 0;
    }
    else {
      iVar20 = 0;
      G_AddViewPitch(-lookspeed[bVar16]);
    }
  }
  BVar9 = Button_MoveLeft.bDown;
  BVar8 = Button_MoveRight.bDown;
  if (Button_MoveRight.bDown != '\0') {
    iVar15 = iVar15 + sidemove[bVar16];
  }
  if (Button_MoveLeft.bDown != '\0') {
    iVar15 = iVar15 - sidemove[bVar16];
  }
  if (Button_Attack.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 1;
  }
  if (Button_AltAttack.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x20;
  }
  if (Button_Use.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 2;
  }
  if (Button_Jump.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 4;
  }
  if (Button_Crouch.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 8;
  }
  if (Button_Zoom.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x80;
  }
  if (Button_Reload.bDown != '\0') {
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x40;
  }
  if (Button_User1.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (Button_User2.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if (Button_User3.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (Button_User4.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 3);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Speed.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Strafe.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  if (BVar8 != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 4;
  }
  if (BVar9 != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if (Button_LookDown.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 2;
  }
  if (Button_LookUp.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if (Button_Back.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if (Button_Forward.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x20;
  }
  if (Button_Right.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  if (Button_Left.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 1);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if (Button_MoveDown.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  if (Button_MoveUp.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 4;
  }
  if (Button_ShowScores.bDown != '\0') {
    pbVar1 = (byte *)((long)&(cmd->ucmd).buttons + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
  I_GetAxes(joyaxes);
  fVar12 = joyaxes[0];
  if (Button_Strafe.bDown == '\0') {
    if (Button_Mlook.bDown == '\0') goto LAB_003a0cc5;
    if (lookstrafe.Value != false) {
      joyaxes[3] = joyaxes[0];
      joyaxes[0] = 0.0;
    }
  }
  else {
    joyaxes[0] = 0.0;
    joyaxes[3] = fVar12;
    if (Button_Mlook.bDown == '\0') goto LAB_003a0cc5;
  }
  joyaxes[1] = joyaxes[2];
  joyaxes[2] = 0.0;
LAB_003a0cc5:
  if ((joyaxes[1] != 0.0) || (NAN(joyaxes[1]))) {
    dVar22 = (double)(joyaxes[1] * 2048.0);
    if (0.0 <= joyaxes[1] * 2048.0) {
      dVar22 = ceil(dVar22);
    }
    else {
      dVar22 = floor(dVar22);
    }
    G_AddViewPitch((int)dVar22);
    LocalKeyboardTurner = true;
  }
  if ((joyaxes[0] != 0.0) || (NAN(joyaxes[0]))) {
    dVar22 = (double)(joyaxes[0] * -1280.0);
    if (0.0 <= joyaxes[0] * -1280.0) {
      dVar22 = ceil(dVar22);
    }
    else {
      dVar22 = floor(dVar22);
    }
    G_AddViewAngle((int)dVar22);
    LocalKeyboardTurner = true;
  }
  dVar22 = (double)((float)sidemove[bVar16] * joyaxes[3]);
  if (0.0 <= (float)sidemove[bVar16] * joyaxes[3]) {
    dVar22 = ceil(dVar22);
  }
  else {
    dVar22 = floor(dVar22);
  }
  dVar23 = (double)((float)forwardmove[bVar16] * joyaxes[2]);
  if (0.0 <= (float)forwardmove[bVar16] * joyaxes[2]) {
    dVar23 = ceil(dVar23);
  }
  else {
    dVar23 = floor(dVar23);
  }
  dVar24 = (double)(joyaxes[4] * 2048.0);
  if (0.0 <= joyaxes[4] * 2048.0) {
    dVar24 = ceil(dVar24);
  }
  else {
    dVar24 = floor(dVar24);
  }
  iVar20 = iVar20 + (int)dVar23;
  if ((Button_Mlook.bDown == '\0') && (freelook.Value == false)) {
    iVar20 = iVar20 + (int)((float)mousey * m_forward.Value);
  }
  (cmd->ucmd).pitch = LocalViewPitch._2_2_;
  iVar11 = forwardmove[1];
  if (SendLand == true) {
    SendLand = false;
    sVar21 = -0x8000;
  }
  else {
    sVar21 = sVar21 + (short)(int)dVar24;
  }
  iVar15 = iVar15 - (int)dVar22;
  if ((BVar10 != '\0') || (lookstrafe.Value == true)) {
    iVar15 = iVar15 + (int)((float)mousex * m_side.Value);
  }
  mousey = 0;
  mousex = 0;
  iVar14 = -forwardmove[1];
  iVar3 = iVar14;
  if (iVar20 != iVar14 && SBORROW4(iVar20,iVar14) == iVar20 + forwardmove[1] < 0) {
    iVar3 = iVar20;
  }
  if (iVar15 != iVar14 && SBORROW4(iVar15,iVar14) == iVar15 + forwardmove[1] < 0) {
    iVar14 = iVar15;
  }
  sVar17 = (short)forwardmove[1];
  sVar18 = (short)iVar3;
  if (forwardmove[1] < iVar20) {
    sVar18 = sVar17;
  }
  psVar2 = &(cmd->ucmd).forwardmove;
  *psVar2 = *psVar2 + sVar18;
  sVar18 = (short)iVar14;
  if (iVar11 < iVar15) {
    sVar18 = sVar17;
  }
  psVar2 = &(cmd->ucmd).sidemove;
  *psVar2 = *psVar2 + sVar18;
  (cmd->ucmd).yaw = LocalViewAngle._2_2_;
  (cmd->ucmd).upmove = sVar21;
  LocalViewAngle = 0;
  LocalViewPitch = 0;
  if (sendturn180 == true) {
    sendturn180 = false;
    *(byte *)&(cmd->ucmd).buttons = (byte)(cmd->ucmd).buttons | 0x10;
  }
  if (sendpause == true) {
    sendpause = false;
    Net_WriteByte('\x14');
  }
  if (sendsave == true) {
    sendsave = false;
    Net_WriteByte('\x15');
    Net_WriteString(savegamefile.Chars);
    Net_WriteString(savedescription);
    FString::operator=(&savegamefile,(char *)"");
  }
  if (SendItemUse != (AInventory *)0x0) {
    if (SendItemUse == (AInventory *)0x1) {
      Net_WriteByte('\x12');
    }
    else {
      Net_WriteByte('\x13');
      Net_WriteLong((SendItemUse->super_AActor).InventoryID);
    }
    SendItemUse = (AInventory *)0x0;
  }
  if (SendItemDrop != (AInventory *)0x0) {
    Net_WriteByte('\"');
    Net_WriteLong((SendItemDrop->super_AActor).InventoryID);
    SendItemDrop = (AInventory *)0x0;
  }
  uVar19._0_2_ = (cmd->ucmd).forwardmove;
  uVar19._2_2_ = (cmd->ucmd).sidemove;
  auVar25 = psllw(ZEXT416(uVar19),8);
  (cmd->ucmd).forwardmove = (short)auVar25._0_4_;
  (cmd->ucmd).sidemove = (short)((uint)auVar25._0_4_ >> 0x10);
  return;
}

Assistant:

void G_BuildTiccmd (ticcmd_t *cmd)
{
	int 		strafe;
	int 		speed;
	int 		forward;
	int 		side;
	int			fly;

	ticcmd_t	*base;

	base = I_BaseTiccmd (); 			// empty, or external driver
	*cmd = *base;

	cmd->consistancy = consistancy[consoleplayer][(maketic/ticdup)%BACKUPTICS];

	strafe = Button_Strafe.bDown;
	speed = Button_Speed.bDown ^ (int)cl_run;

	forward = side = fly = 0;

	// [RH] only use two stage accelerative turning on the keyboard
	//		and not the joystick, since we treat the joystick as
	//		the analog device it is.
	if (Button_Left.bDown || Button_Right.bDown)
		turnheld += ticdup;
	else
		turnheld = 0;

	// let movement keys cancel each other out
	if (strafe)
	{
		if (Button_Right.bDown)
			side += sidemove[speed];
		if (Button_Left.bDown)
			side -= sidemove[speed];
	}
	else
	{
		int tspeed = speed;

		if (turnheld < SLOWTURNTICS)
			tspeed += 2;		// slow turn
		
		if (Button_Right.bDown)
		{
			G_AddViewAngle (angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
		if (Button_Left.bDown)
		{
			G_AddViewAngle (-angleturn[tspeed]);
			LocalKeyboardTurner = true;
		}
	}

	if (Button_LookUp.bDown)
	{
		G_AddViewPitch (lookspeed[speed]);
		LocalKeyboardTurner = true;
	}
	if (Button_LookDown.bDown)
	{
		G_AddViewPitch (-lookspeed[speed]);
		LocalKeyboardTurner = true;
	}

	if (Button_MoveUp.bDown)
		fly += flyspeed[speed];
	if (Button_MoveDown.bDown)
		fly -= flyspeed[speed];

	if (Button_Klook.bDown)
	{
		if (Button_Forward.bDown)
			G_AddViewPitch (lookspeed[speed]);
		if (Button_Back.bDown)
			G_AddViewPitch (-lookspeed[speed]);
	}
	else
	{
		if (Button_Forward.bDown)
			forward += forwardmove[speed];
		if (Button_Back.bDown)
			forward -= forwardmove[speed];
	}

	if (Button_MoveRight.bDown)
		side += sidemove[speed];
	if (Button_MoveLeft.bDown)
		side -= sidemove[speed];

	// buttons
	if (Button_Attack.bDown)		cmd->ucmd.buttons |= BT_ATTACK;
	if (Button_AltAttack.bDown)		cmd->ucmd.buttons |= BT_ALTATTACK;
	if (Button_Use.bDown)			cmd->ucmd.buttons |= BT_USE;
	if (Button_Jump.bDown)			cmd->ucmd.buttons |= BT_JUMP;
	if (Button_Crouch.bDown)		cmd->ucmd.buttons |= BT_CROUCH;
	if (Button_Zoom.bDown)			cmd->ucmd.buttons |= BT_ZOOM;
	if (Button_Reload.bDown)		cmd->ucmd.buttons |= BT_RELOAD;

	if (Button_User1.bDown)			cmd->ucmd.buttons |= BT_USER1;
	if (Button_User2.bDown)			cmd->ucmd.buttons |= BT_USER2;
	if (Button_User3.bDown)			cmd->ucmd.buttons |= BT_USER3;
	if (Button_User4.bDown)			cmd->ucmd.buttons |= BT_USER4;

	if (Button_Speed.bDown)			cmd->ucmd.buttons |= BT_SPEED;
	if (Button_Strafe.bDown)		cmd->ucmd.buttons |= BT_STRAFE;
	if (Button_MoveRight.bDown)		cmd->ucmd.buttons |= BT_MOVERIGHT;
	if (Button_MoveLeft.bDown)		cmd->ucmd.buttons |= BT_MOVELEFT;
	if (Button_LookDown.bDown)		cmd->ucmd.buttons |= BT_LOOKDOWN;
	if (Button_LookUp.bDown)		cmd->ucmd.buttons |= BT_LOOKUP;
	if (Button_Back.bDown)			cmd->ucmd.buttons |= BT_BACK;
	if (Button_Forward.bDown)		cmd->ucmd.buttons |= BT_FORWARD;
	if (Button_Right.bDown)			cmd->ucmd.buttons |= BT_RIGHT;
	if (Button_Left.bDown)			cmd->ucmd.buttons |= BT_LEFT;
	if (Button_MoveDown.bDown)		cmd->ucmd.buttons |= BT_MOVEDOWN;
	if (Button_MoveUp.bDown)		cmd->ucmd.buttons |= BT_MOVEUP;
	if (Button_ShowScores.bDown)	cmd->ucmd.buttons |= BT_SHOWSCORES;

	// Handle joysticks/game controllers.
	float joyaxes[NUM_JOYAXIS];

	I_GetAxes(joyaxes);

	// Remap some axes depending on button state.
	if (Button_Strafe.bDown || (Button_Mlook.bDown && lookstrafe))
	{
		joyaxes[JOYAXIS_Side] = joyaxes[JOYAXIS_Yaw];
		joyaxes[JOYAXIS_Yaw] = 0;
	}
	if (Button_Mlook.bDown)
	{
		joyaxes[JOYAXIS_Pitch] = joyaxes[JOYAXIS_Forward];
		joyaxes[JOYAXIS_Forward] = 0;
	}

	if (joyaxes[JOYAXIS_Pitch] != 0)
	{
		G_AddViewPitch(joyint(joyaxes[JOYAXIS_Pitch] * 2048));
		LocalKeyboardTurner = true;
	}
	if (joyaxes[JOYAXIS_Yaw] != 0)
	{
		G_AddViewAngle(joyint(-1280 * joyaxes[JOYAXIS_Yaw]));
		LocalKeyboardTurner = true;
	}

	side -= joyint(sidemove[speed] * joyaxes[JOYAXIS_Side]);
	forward += joyint(joyaxes[JOYAXIS_Forward] * forwardmove[speed]);
	fly += joyint(joyaxes[JOYAXIS_Up] * 2048);

	// Handle mice.
	if (!Button_Mlook.bDown && !freelook)
	{
		forward += (int)((float)mousey * m_forward);
	}

	cmd->ucmd.pitch = LocalViewPitch >> 16;

	if (SendLand)
	{
		SendLand = false;
		fly = -32768;
	}

	if (strafe || lookstrafe)
		side += (int)((float)mousex * m_side);

	mousex = mousey = 0;

	// Build command.
	if (forward > MAXPLMOVE)
		forward = MAXPLMOVE;
	else if (forward < -MAXPLMOVE)
		forward = -MAXPLMOVE;
	if (side > MAXPLMOVE)
		side = MAXPLMOVE;
	else if (side < -MAXPLMOVE)
		side = -MAXPLMOVE;

	cmd->ucmd.forwardmove += forward;
	cmd->ucmd.sidemove += side;
	cmd->ucmd.yaw = LocalViewAngle >> 16;
	cmd->ucmd.upmove = fly;
	LocalViewAngle = 0;
	LocalViewPitch = 0;

	// special buttons
	if (sendturn180)
	{
		sendturn180 = false;
		cmd->ucmd.buttons |= BT_TURN180;
	}
	if (sendpause)
	{
		sendpause = false;
		Net_WriteByte (DEM_PAUSE);
	}
	if (sendsave)
	{
		sendsave = false;
		Net_WriteByte (DEM_SAVEGAME);
		Net_WriteString (savegamefile);
		Net_WriteString (savedescription);
		savegamefile = "";
	}
	if (SendItemUse == (const AInventory *)1)
	{
		Net_WriteByte (DEM_INVUSEALL);
		SendItemUse = NULL;
	}
	else if (SendItemUse != NULL)
	{
		Net_WriteByte (DEM_INVUSE);
		Net_WriteLong (SendItemUse->InventoryID);
		SendItemUse = NULL;
	}
	if (SendItemDrop != NULL)
	{
		Net_WriteByte (DEM_INVDROP);
		Net_WriteLong (SendItemDrop->InventoryID);
		SendItemDrop = NULL;
	}

	cmd->ucmd.forwardmove <<= 8;
	cmd->ucmd.sidemove <<= 8;
}